

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

void crnlib::end_nonzero_run(uint *size,uint len,vector<unsigned_short> *codes)

{
  uint uVar1;
  uint uVar2;
  short sVar3;
  unsigned_short uVar4;
  
  uVar2 = *size;
  if (uVar2 != 0) {
    if (uVar2 < 3) {
      uVar1 = *size;
      *size = *size - 1;
      if (uVar1 != 0) {
        do {
          if (codes->m_capacity <= codes->m_size) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)codes,codes->m_size + 1,true,2,(object_mover)0x0,false);
          }
          codes->m_p[codes->m_size] = (unsigned_short)len;
          codes->m_size = codes->m_size + 1;
          uVar1 = *size;
          *size = *size - 1;
        } while (uVar1 != 0);
      }
    }
    else {
      sVar3 = (short)uVar2 * 0x100;
      if (uVar2 < 7) {
        uVar4 = sVar3 - 0x2ed;
      }
      else {
        uVar4 = sVar3 - 0x6ec;
      }
      if (codes->m_capacity <= codes->m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)codes,codes->m_size + 1,true,2,(object_mover)0x0,false);
      }
      codes->m_p[codes->m_size] = uVar4;
      codes->m_size = codes->m_size + 1;
    }
    *size = 0;
  }
  return;
}

Assistant:

static inline void end_nonzero_run(uint& size, uint len, crnlib::vector<uint16>& codes)
    {
        if (!size)
        {
            return;
        }

        if (size < cSmallMinNonZeroRunSize)
        {
            while (size--)
            {
                codes.push_back(static_cast<uint16>(len));
            }
        }
        else if (size <= cSmallMaxNonZeroRunSize)
        {
            codes.push_back(static_cast<uint16>(cSmallRepeatCode | ((size - cSmallMinNonZeroRunSize) << 8)));
        }
        else
        {
            CRNLIB_ASSERT((size >= cLargeMinNonZeroRunSize) && (size <= cLargeMaxNonZeroRunSize));
            codes.push_back(static_cast<uint16>(cLargeRepeatCode | ((size - cLargeMinNonZeroRunSize) << 8)));
        }

        size = 0;
    }